

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayFBOIncompleteness.cpp
# Opt level: O2

GLboolean __thiscall
glcts::TextureCubeMapArrayFBOIncompleteness::checkState
          (TextureCubeMapArrayFBOIncompleteness *this,GLint expected_state,char *message)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  bool bVar2;
  Enum<int,_2UL> local_1c0;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [384];
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1c0.m_value = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x170))(0x8ca9);
  bVar2 = local_1c0.m_value == expected_state;
  if (!bVar2) {
    local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,message);
    std::operator<<((ostream *)this_00,"; FBO should be in ");
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = expected_state;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this_00);
    std::operator<<((ostream *)this_00," state, but is in : ");
    local_1c0.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::operator<<((ostream *)this_00," state");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return bVar2;
}

Assistant:

glw::GLboolean TextureCubeMapArrayFBOIncompleteness::checkState(glw::GLint expected_state, const char* message)
{
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	glw::GLenum			  fbo_completeness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);
	glw::GLboolean		  result		   = true;

	/* if fboCompleteness is different than expectedState log error */
	if (fbo_completeness != (glw::GLuint)expected_state)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << message << "; FBO should be in "
						   << glu::getErrorStr(expected_state)
						   << " state, but is in : " << glu::getErrorStr(fbo_completeness) << " state"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	return result;
}